

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

ZSTD_CCtx_params * ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters cParams)

{
  int iVar1;
  void *in_RDI;
  uint in_stack_00000008;
  uint in_stack_0000000c;
  uint in_stack_00000010;
  uint in_stack_00000014;
  uint in_stack_00000018;
  uint in_stack_0000001c;
  
  if (in_RDI != (void *)0x0) {
    memset(in_RDI,0,0xb0);
    *(undefined4 *)((long)in_RDI + 0x2c) = 3;
    *(undefined4 *)((long)in_RDI + 0x20) = 1;
  }
  *(ulong *)((long)in_RDI + 0x10) = CONCAT44(in_stack_00000018,in_stack_00000014);
  *(ulong *)((long)in_RDI + 0x18) = CONCAT44(cParams.windowLog,in_stack_0000001c);
  *(ulong *)((long)in_RDI + 4) = CONCAT44(in_stack_0000000c,in_stack_00000008);
  *(ulong *)((long)in_RDI + 0xc) = CONCAT44(in_stack_00000014,in_stack_00000010);
  if (0x1a < in_stack_00000008 && 6 < cParams.windowLog) {
    *(undefined4 *)((long)in_RDI + 0x60) = 1;
    ZSTD_ldm_adjustParameters
              ((ldmParams_t *)((long)in_RDI + 0x60),(ZSTD_compressionParameters *)&stack0x00000008);
  }
  if (0x10 < in_stack_00000008 && 6 < cParams.windowLog) {
    *(undefined4 *)((long)in_RDI + 0x8c) = 1;
  }
  iVar1 = *(int *)((long)in_RDI + 0x90);
  if ((iVar1 == 0) && (iVar1 = 1, 0xfffffffc < cParams.windowLog - 6)) {
    iVar1 = 2 - (uint)(in_stack_00000008 < 0xf);
  }
  *(int *)((long)in_RDI + 0x90) = iVar1;
  return (ZSTD_CCtx_params *)(ulong)in_stack_00000008;
}

Assistant:

static ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(
        ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params cctxParams;
    /* should not matter, as all cParams are presumed properly defined */
    ZSTD_CCtxParams_init(&cctxParams, ZSTD_CLEVEL_DEFAULT);
    cctxParams.cParams = cParams;

    /* Adjust advanced params according to cParams */
    if (ZSTD_CParams_shouldEnableLdm(&cParams)) {
        DEBUGLOG(4, "ZSTD_makeCCtxParamsFromCParams(): Including LDM into cctx params");
        cctxParams.ldmParams.enableLdm = 1;
        /* LDM is enabled by default for optimal parser and window size >= 128MB */
        ZSTD_ldm_adjustParameters(&cctxParams.ldmParams, &cParams);
        assert(cctxParams.ldmParams.hashLog >= cctxParams.ldmParams.bucketSizeLog);
        assert(cctxParams.ldmParams.hashRateLog < 32);
    }

    if (ZSTD_CParams_useBlockSplitter(&cParams)) {
        DEBUGLOG(4, "ZSTD_makeCCtxParamsFromCParams(): Including block splitting into cctx params");
        cctxParams.splitBlocks = 1;
    }

    cctxParams.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams.useRowMatchFinder, &cParams);
    assert(!ZSTD_checkCParams(cParams));
    return cctxParams;
}